

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

optional_idx __thiscall
duckdb::FunctionBinder::MultipleCandidateException<duckdb::AggregateFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::AggregateFunction> *functions,
          vector<unsigned_long,_true> *candidate_functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  idx_t *piVar1;
  idx_t *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string candidate_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0 [32];
  string call_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  AggregateFunction f;
  
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arguments;
  LogicalType::LogicalType((LogicalType *)&f,INVALID);
  Function::CallToString(&call_str,name,arguments,(LogicalType *)&f);
  LogicalType::~LogicalType((LogicalType *)&f);
  candidate_str._M_dataplus._M_p = (pointer)&candidate_str.field_2;
  candidate_str._M_string_length = 0;
  candidate_str.field_2._M_local_buf[0] = '\0';
  piVar1 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (candidate_functions->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset(&f,functions,*piVar2);
    BaseScalarFunction::ToString_abi_cxx11_(&local_180,&f.super_BaseScalarFunction);
    ::std::operator+(&local_1a0,anon_var_dwarf_4b102f7 + 7,&local_180);
    ::std::operator+(&local_260,&local_1a0,anon_var_dwarf_4b0ff16 + 8);
    ::std::__cxx11::string::append((string *)&candidate_str);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_180);
    AggregateFunction::~AggregateFunction(&f);
  }
  ::std::__cxx11::string::string
            (local_1e0,
             "Could not choose a best candidate function for the function call \"%s\". In order to select one, please add explicit type casts.\n\tCandidate functions:\n%s"
             ,(allocator *)&local_1a0);
  ::std::__cxx11::string::string((string *)&local_200,(string *)&call_str);
  ::std::__cxx11::string::string((string *)&local_220,(string *)&candidate_str);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_260,(StringUtil *)local_1e0,&local_200,&local_220,params_1);
  ErrorData::ErrorData((ErrorData *)&f,BINDER,&local_260);
  ErrorData::operator=(error,(ErrorData *)&f);
  ErrorData::~ErrorData((ErrorData *)&f);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_200);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::__cxx11::string::~string((string *)&candidate_str);
  ::std::__cxx11::string::~string((string *)&call_str);
  return (optional_idx)0xffffffffffffffff;
}

Assistant:

optional_idx FunctionBinder::MultipleCandidateException(const string &name, FunctionSet<T> &functions,
                                                        vector<idx_t> &candidate_functions,
                                                        const vector<LogicalType> &arguments, ErrorData &error) {
	D_ASSERT(functions.functions.size() > 1);
	// there are multiple possible function definitions
	// throw an exception explaining which overloads are there
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &conf : candidate_functions) {
		T f = functions.GetFunctionByOffset(conf);
		candidate_str += "\t" + f.ToString() + "\n";
	}
	error = ErrorData(
	    ExceptionType::BINDER,
	    StringUtil::Format("Could not choose a best candidate function for the function call \"%s\". In order to "
	                       "select one, please add explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str));
	return optional_idx();
}